

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

OSToken * OSToken::accessToken(string *basePath,string *tokenDir,int umask)

{
  OSToken *__rhs;
  int in_stack_000000f4;
  string *in_stack_000000f8;
  OSToken *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff9c;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  __rhs = (OSToken *)operator_new(0xe8);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff9c,uVar1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  OSToken(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return __rhs;
}

Assistant:

OSToken *OSToken::accessToken(const std::string &basePath, const std::string &tokenDir, int umask)
{
	return new OSToken(basePath + OS_PATHSEP + tokenDir, umask);
}